

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiff_io.cc
# Opt level: O0

void __thiscall
gimage::anon_unknown_6::TiffImage<unsigned_short>::~TiffImage(TiffImage<unsigned_short> *this)

{
  undefined8 *in_RDI;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *unaff_retaddr;
  
  TIFFClose(*in_RDI);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)unaff_retaddr);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)unaff_retaddr);
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::~Image(unaff_retaddr);
  return;
}

Assistant:

~TiffImage()
    {
      TIFFClose(tif);
    }